

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O2

void init_qp(int16_t *round_ptr,int16_t *quant_ptr,int16_t *dequant_ptr,int log_scale,__m256i *thr,
            __m256i *qp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [16];
  
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  if (0 < log_scale) {
    auVar6._0_2_ = (undefined2)(1 << ((char)log_scale - 1U & 0x1f));
    auVar6._2_2_ = auVar6._0_2_;
    auVar6._4_2_ = auVar6._0_2_;
    auVar6._6_2_ = auVar6._0_2_;
    auVar6._8_2_ = auVar6._0_2_;
    auVar6._10_2_ = auVar6._0_2_;
    auVar6._12_2_ = auVar6._0_2_;
    auVar6._14_2_ = auVar6._0_2_;
    auVar1 = vpaddw_avx(auVar6,auVar1);
    auVar1 = vpsraw_avx(auVar1,ZEXT416((uint)log_scale));
  }
  auVar6 = *(undefined1 (*) [16])dequant_ptr;
  alVar5 = (__m256i)vpermq_avx2(ZEXT1632(auVar1),0x54);
  *qp = alVar5;
  alVar5 = (__m256i)vpermq_avx2(ZEXT1632(auVar2),0x54);
  if (log_scale == 1) {
    alVar5 = (__m256i)vpaddw_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5);
  }
  qp[1] = alVar5;
  alVar5 = (__m256i)vpermq_avx2(ZEXT1632(auVar6),0x54);
  auVar4 = vpsraw_avx2((undefined1  [32])alVar5,ZEXT416(log_scale + 1));
  qp[2] = alVar5;
  auVar3 = vpcmpeqd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5);
  alVar5 = (__m256i)vpaddw_avx2(auVar4,auVar3);
  *thr = alVar5;
  return;
}

Assistant:

static inline void init_qp(const int16_t *zbin_ptr, const int16_t *round_ptr,
                           const int16_t *quant_ptr, const int16_t *dequant_ptr,
                           const int16_t *quant_shift_ptr, __m256i *qp,
                           int log_scale) {
  const __m128i zbin = _mm_loadu_si128((const __m128i *)zbin_ptr);
  const __m128i round = _mm_loadu_si128((const __m128i *)round_ptr);
  const __m128i quant = _mm_loadu_si128((const __m128i *)quant_ptr);
  const __m128i dequant = _mm_loadu_si128((const __m128i *)dequant_ptr);
  const __m128i quant_shift = _mm_loadu_si128((const __m128i *)quant_shift_ptr);
  init_one_qp(&zbin, &qp[0]);
  init_one_qp(&round, &qp[1]);
  init_one_qp(&quant, &qp[2]);
  init_one_qp(&dequant, &qp[3]);
  init_one_qp(&quant_shift, &qp[4]);
  if (log_scale > 0) {
    const __m256i rnd = _mm256_set1_epi32((int16_t)(1 << (log_scale - 1)));
    qp[0] = _mm256_add_epi32(qp[0], rnd);
    qp[0] = _mm256_srai_epi32(qp[0], log_scale);

    qp[1] = _mm256_add_epi32(qp[1], rnd);
    qp[1] = _mm256_srai_epi32(qp[1], log_scale);
  }
  // Subtracting 1 here eliminates a _mm256_cmpeq_epi32() instruction when
  // calculating the zbin mask.
  qp[0] = _mm256_sub_epi32(qp[0], _mm256_set1_epi32(1));
}